

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O0

int mg_secure_transport_init
              (int sockfd,char *cert_file,char *key_file,mg_secure_transport **transport,
              mg_allocator *allocator)

{
  int iVar1;
  SSL_METHOD *meth;
  EVP_MD *type;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  mg_secure_transport *ttransport;
  uint peer_pubkey_fp_len;
  uchar peer_pubkey_fp [64];
  char *peer_pubkey_type;
  int nid;
  EVP_PKEY *peer_pubkey;
  X509 *peer_cert;
  int ret;
  int status;
  BIO *bio;
  SSL *ssl;
  SSL_CTX *ctx;
  X509 *data;
  char *pcVar3;
  uchar *in_stack_ffffffffffffff50;
  uchar local_a8 [64];
  mg_allocator *local_68;
  int local_5c;
  EVP_PKEY *local_58;
  X509 *local_50;
  int local_48;
  int local_44;
  BIO *local_40;
  SSL *local_38;
  SSL_CTX *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char *local_10;
  int local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  mg_openssl_init();
  local_30 = (SSL_CTX *)0x0;
  local_38 = (SSL *)0x0;
  local_40 = (BIO *)0x0;
  local_44 = 0;
  ERR_clear_error();
  meth = (SSL_METHOD *)TLS_client_method();
  local_30 = SSL_CTX_new(meth);
  if (local_30 == (SSL_CTX *)0x0) {
    local_44 = -0x11;
  }
  else if (((local_10 == (char *)0x0) || (local_18 == (char *)0x0)) ||
          ((iVar1 = SSL_CTX_use_certificate_chain_file(local_30,local_10), iVar1 == 1 &&
           (iVar1 = SSL_CTX_use_PrivateKey_file(local_30,local_18,1), iVar1 == 1)))) {
    SSL_CTX_set_options(local_30);
    local_38 = SSL_new(local_30);
    if (local_38 == (SSL *)0x0) {
      local_44 = -0x11;
    }
    else {
      SSL_CTX_free(local_30);
      local_30 = (SSL_CTX *)0x0;
      local_40 = BIO_new_socket(local_8,0);
      if (local_40 == (BIO *)0x0) {
        local_44 = -0x11;
      }
      else {
        SSL_set_bio(local_38,local_40,local_40);
        local_48 = SSL_connect(local_38);
        if (local_48 < 0) {
          local_44 = -0x11;
        }
        else {
          local_50 = (X509 *)SSL_get1_peer_certificate(local_38);
          local_58 = X509_get_pubkey(local_50);
          local_5c = EVP_PKEY_get_base_id(local_58);
          EVP_PKEY_free(local_58);
          if (local_5c == 0) {
            pcVar3 = "UNKNOWN";
          }
          else {
            pcVar3 = OBJ_nid2ln(local_5c);
          }
          data = local_50;
          local_68 = (mg_allocator *)pcVar3;
          type = EVP_sha512();
          iVar1 = X509_pubkey_digest(data,type,local_a8,(uint *)&stack0xffffffffffffff54);
          if (iVar1 == 1) {
            X509_free(local_50);
            puVar2 = (undefined8 *)mg_allocator_malloc((mg_allocator *)pcVar3,(size_t)data);
            if (puVar2 != (undefined8 *)0x0) {
              BIO_ctrl(local_40,9,1,(void *)0x0);
              puVar2[5] = local_38;
              puVar2[6] = local_40;
              puVar2[7] = local_68;
              pcVar3 = hex_encode(in_stack_ffffffffffffff50,(uint)((ulong)puVar2 >> 0x20),
                                  (mg_allocator *)pcVar3);
              puVar2[8] = pcVar3;
              *puVar2 = mg_secure_transport_send;
              puVar2[1] = mg_secure_transport_recv;
              puVar2[3] = 0;
              puVar2[4] = 0;
              puVar2[2] = mg_secure_transport_destroy;
              puVar2[9] = local_28;
              *local_20 = puVar2;
              return 0;
            }
            local_44 = -3;
          }
          else {
            local_44 = -0x11;
            X509_free(local_50);
          }
        }
      }
    }
  }
  else {
    local_44 = -0x11;
  }
  if (local_44 == -0x11) {
    ERR_print_errors_cb(print_ssl_error,"mg_secure_transport_init");
  }
  SSL_CTX_free(local_30);
  if (local_38 == (SSL *)0x0) {
    BIO_free(local_40);
  }
  else {
    SSL_free(local_38);
  }
  return local_44;
}

Assistant:

int mg_secure_transport_init(int sockfd, const char *cert_file,
                             const char *key_file,
                             mg_secure_transport **transport,
                             mg_allocator *allocator) {
  mg_openssl_init();

  SSL_CTX *ctx = NULL;
  SSL *ssl = NULL;
  BIO *bio = NULL;

  int status = 0;

  ERR_clear_error();

#if OPENSSL_VERSION_NUMBER < 0x10100000L
  ctx = SSL_CTX_new(SSLv23_client_method());
#else
  ctx = SSL_CTX_new(TLS_client_method());
#endif

  if (!ctx) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  if (cert_file && key_file) {
    if (SSL_CTX_use_certificate_chain_file(ctx, cert_file) != 1 ||
        SSL_CTX_use_PrivateKey_file(ctx, key_file, SSL_FILETYPE_PEM) != 1) {
      status = MG_ERROR_SSL_ERROR;
      goto failure;
    }
  }

  SSL_CTX_set_options(ctx, SSL_OP_NO_SSLv3);
  ssl = SSL_new(ctx);

  if (!ssl) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // SSL_CTX object is reference counted, we're destroying this local reference,
  // but reference from SSL object stays.
  SSL_CTX_free(ctx);
  ctx = NULL;

  bio = BIO_new_socket(sockfd, BIO_NOCLOSE);
  if (!bio) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }
  SSL_set_bio(ssl, bio, bio);

  int ret = SSL_connect(ssl);
  if (ret < 0) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // Get server's public key type and fingerprint.
  X509 *peer_cert = SSL_get_peer_certificate(ssl);
  assert(peer_cert);
  EVP_PKEY *peer_pubkey = X509_get_pubkey(peer_cert);
  int nid = EVP_PKEY_base_id(peer_pubkey);
  EVP_PKEY_free(peer_pubkey);
  const char *peer_pubkey_type =
      (nid == NID_undef) ? "UNKNOWN" : OBJ_nid2ln(nid);
  unsigned char peer_pubkey_fp[EVP_MAX_MD_SIZE];
  unsigned int peer_pubkey_fp_len;
  if (X509_pubkey_digest(peer_cert, EVP_sha512(), peer_pubkey_fp,
                         &peer_pubkey_fp_len) != 1) {
    status = MG_ERROR_SSL_ERROR;
    X509_free(peer_cert);
    goto failure;
  }
  X509_free(peer_cert);

  mg_secure_transport *ttransport =
      mg_allocator_malloc(allocator, sizeof(mg_secure_transport));
  if (!ttransport) {
    status = MG_ERROR_OOM;
    goto failure;
  }

  // Take ownership of the socket now that everything went well.
  BIO_set_close(bio, BIO_CLOSE);

  ttransport->ssl = ssl;
  ttransport->bio = bio;
  ttransport->peer_pubkey_type = peer_pubkey_type;
  ttransport->peer_pubkey_fp =
      hex_encode(peer_pubkey_fp, peer_pubkey_fp_len, allocator);
  ttransport->send = mg_secure_transport_send;
  ttransport->recv = mg_secure_transport_recv;
  ttransport->suspend_until_ready_to_read = NULL;
  ttransport->suspend_until_ready_to_write = NULL;
  ttransport->destroy = mg_secure_transport_destroy;
  ttransport->allocator = allocator;
  *transport = ttransport;

  return 0;

failure:
  if (status == MG_ERROR_SSL_ERROR) {
    ERR_print_errors_cb(print_ssl_error, "mg_secure_transport_init");
  }
  SSL_CTX_free(ctx);
  if (ssl) {
    // If SSL object was successfuly created, it owns the BIO so we don't need
    // to destroy it.
    SSL_free(ssl);
  } else {
    BIO_free(bio);
  }

  return status;
}